

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeSerializer.cpp
# Opt level: O1

byte * __thiscall
Js::ByteCodeBufferReader::ReadAsmJsConstantsTable
          (ByteCodeBufferReader *this,byte *current,FunctionBody *function)

{
  WriteBarrierPtr<void> *pWVar1;
  code *pcVar2;
  bool bVar3;
  uint32 uVar4;
  uint32 uVar5;
  AsmJsFunctionInfo *this_00;
  TypedSlotInfo *pTVar6;
  undefined4 *puVar7;
  Types type;
  uint lineNumber;
  ulong uVar8;
  WriteBarrierPtr<void> *value;
  uint uVar9;
  int iVar10;
  byte *remainingBytes;
  
  FunctionBody::CreateConstantTable(function);
  pWVar1 = (function->m_constTable).ptr;
  uVar4 = FunctionBody::GetCountField(function,ConstantCount);
  type = INT32;
  do {
    this_00 = (AsmJsFunctionInfo *)
              FunctionProxy::GetAuxPtr((FunctionProxy *)function,AsmJsFunctionInfo);
    pTVar6 = AsmJsFunctionInfo::GetTypedSlotInfo(this_00,type);
    uVar9 = pTVar6->constCount;
    if (1 < uVar9) {
      uVar5 = WAsmJs::GetTypeByteSize(type);
      if ((1 < type - FLOAT32) && (type != INT32)) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar7 = 1;
        lineNumber = 0xcee;
LAB_008936f6:
        bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeSerializer.cpp"
                                    ,lineNumber,"((0))","UNREACHED");
        if (!bVar3) {
          pcVar2 = (code *)invalidInstructionException();
          (*pcVar2)();
        }
        *puVar7 = 0;
        Throw::FatalInternalError(-0x7fffbffb);
      }
      uVar8 = (ulong)uVar5;
      value = (WriteBarrierPtr<void> *)((long)&pWVar1->ptr + pTVar6->constSrcByteOffset + uVar8);
      remainingBytes = this->raw + ((long)this->totalSize - (long)current);
      if (uVar9 < 3) {
        uVar9 = 2;
      }
      iVar10 = uVar9 - 1;
      do {
        if (type == FLOAT32) {
          ReadFloat(current,(size_t)remainingBytes,(float *)value);
        }
        else if (type == INT32) {
          ReadConstantSizedInt32(current,(size_t)remainingBytes,(int *)value);
        }
        else {
          ReadDouble(current,(size_t)remainingBytes,(double *)value);
        }
        current = current + uVar8;
        remainingBytes = remainingBytes + -uVar8;
        value = (WriteBarrierPtr<void> *)((long)&value->ptr + uVar8);
        iVar10 = iVar10 + -1;
      } while (iVar10 != 0);
      if (pWVar1 + uVar4 < value) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar7 = 1;
        lineNumber = 0xcf9;
        goto LAB_008936f6;
      }
    }
    type = type + INT64;
    if (type == LIMIT) {
      return current;
    }
  } while( true );
}

Assistant:

const byte * ReadAsmJsConstantsTable(const byte * current, FunctionBody * function)
    {
#ifdef BYTE_CODE_MAGIC_CONSTANTS
        int constant;
        current = ReadInt32(current, &constant);
        Assert(constant == magicStartOfConstantTable);
#endif

        function->CreateConstantTable();

        auto constTable = function->GetConstTable();
        byte* tableEnd = (byte*)(constTable + function->GetConstantCount());

        for (int i = 0; i < WAsmJs::LIMIT; ++i)
        {
            WAsmJs::Types type = (WAsmJs::Types)i;
            WAsmJs::TypedSlotInfo* typedInfo = function->GetAsmJsFunctionInfo()->GetTypedSlotInfo(type);
            uint32 constCount = typedInfo->constCount;
            if (constCount > FunctionBody::FirstRegSlot)
            {
                uint32 typeSize = WAsmJs::GetTypeByteSize(type);
                byte* byteTable = ((byte*)constTable) + typedInfo->constSrcByteOffset;
                byteTable += typeSize * FunctionBody::FirstRegSlot;

                size_t remainingBytes = (raw + totalSize) - current;
                for (uint32 reg = FunctionBody::FirstRegSlot; reg < constCount; ++reg)
                {
                    switch (type)
                    {
                    case WAsmJs::INT32:   ReadConstantSizedInt32(current, remainingBytes, (int*)byteTable); break;
                    case WAsmJs::FLOAT32: ReadFloat(current, remainingBytes, (float*)byteTable); break;
                    case WAsmJs::FLOAT64: ReadDouble(current, remainingBytes, (double*)byteTable); break;
                    default:
                        Assert(UNREACHED);
                        Js::Throw::FatalInternalError();
                        break;
                    }
                    current += typeSize;
                    byteTable += typeSize;
                    remainingBytes -= typeSize;
                }

                if (byteTable > tableEnd)
                {
                    Assert(UNREACHED);
                    Js::Throw::FatalInternalError();
                }
            }
        }

#ifdef BYTE_CODE_MAGIC_CONSTANTS
        current = ReadInt32(current, &constant);
        Assert(constant == magicEndOfConstantTable);
#endif

        return current;
    }